

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void LogTextV(ImGuiContext *g,char *fmt,__va_list_tag *args)

{
  int iVar1;
  char *data;
  __va_list_tag *args_local;
  char *fmt_local;
  ImGuiContext *g_local;
  
  if (g->LogFile == (ImFileHandle)0x0) {
    ImGuiTextBuffer::appendfv(&g->LogBuffer,fmt,args);
  }
  else {
    ImVector<char>::resize(&(g->LogBuffer).Buf,0);
    ImGuiTextBuffer::appendfv(&g->LogBuffer,fmt,args);
    data = ImGuiTextBuffer::c_str(&g->LogBuffer);
    iVar1 = ImGuiTextBuffer::size(&g->LogBuffer);
    ImFileWrite(data,1,(long)iVar1,g->LogFile);
  }
  return;
}

Assistant:

static inline void LogTextV(ImGuiContext& g, const char* fmt, va_list args)
{
    if (g.LogFile)
    {
        g.LogBuffer.Buf.resize(0);
        g.LogBuffer.appendfv(fmt, args);
        ImFileWrite(g.LogBuffer.c_str(), sizeof(char), (ImU64)g.LogBuffer.size(), g.LogFile);
    }
    else
    {
        g.LogBuffer.appendfv(fmt, args);
    }
}